

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O1

void __thiscall QAbstractSocketPrivate::_q_testConnection(QAbstractSocketPrivate *this)

{
  SocketState SVar1;
  SocketError SVar2;
  
  if (this->connectTimer != (QTimer *)0x0) {
    QTimer::stop();
  }
  if ((QAbstractSocketEngine *)this->socketEngine != (QAbstractSocketEngine *)0x0) {
    SVar1 = QAbstractSocketEngine::state((QAbstractSocketEngine *)this->socketEngine);
    if (SVar1 == ConnectedState) {
      fetchConnectionParameters(this);
      if (this->pendingClose == true) {
        (**(code **)(**(long **)&this->field_0x8 + 0x100))();
        this->pendingClose = false;
      }
      return;
    }
    SVar2 = QAbstractSocketEngine::error((QAbstractSocketEngine *)this->socketEngine);
    if (((uint)(SVar2 + ~SslHandshakeFailedError) < 5) ||
       (SVar2 == ProxyAuthenticationRequiredError)) {
      QList<QHostAddress>::clear(&this->addresses);
    }
  }
  _q_connectToNextAddress(this);
  return;
}

Assistant:

void QAbstractSocketPrivate::_q_testConnection()
{
    if (connectTimer)
        connectTimer->stop();

    if (socketEngine) {
        if (socketEngine->state() == QAbstractSocket::ConnectedState) {
            // Fetch the parameters if our connection is completed;
            // otherwise, fall out and try the next address.
            fetchConnectionParameters();
            if (pendingClose) {
                q_func()->disconnectFromHost();
                pendingClose = false;
            }
            return;
        }

        // don't retry the other addresses if we had a proxy error
        if (isProxyError(socketEngine->error()))
            addresses.clear();
    }

#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocketPrivate::_q_testConnection() connection failed,"
           " checking for alternative addresses");
#endif
    _q_connectToNextAddress();
}